

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_2s_i64(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
                  TCGv_i64 c,_Bool scalar_first,
                  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict9 *fni)

{
  TCGv_i64 arg;
  TCGv_i64 arg_00;
  uint local_44;
  uint32_t i;
  TCGv_i64 t1;
  TCGv_i64 t0;
  _Bool scalar_first_local;
  TCGv_i64 c_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_i64(tcg_ctx);
  arg_00 = tcg_temp_new_i64(tcg_ctx);
  for (local_44 = 0; local_44 < oprsz; local_44 = local_44 + 8) {
    tcg_gen_ld_i64_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(aofs + local_44));
    if (scalar_first) {
      (*fni)(tcg_ctx,arg_00,c,arg);
    }
    else {
      (*fni)(tcg_ctx,arg_00,arg,c);
    }
    tcg_gen_st_i64_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(dofs + local_44));
  }
  tcg_temp_free_i64(tcg_ctx,arg);
  tcg_temp_free_i64(tcg_ctx,arg_00);
  return;
}

Assistant:

static void expand_2s_i64(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                          TCGv_i64 c, bool scalar_first,
                          void (*fni)(TCGContext *, TCGv_i64, TCGv_i64, TCGv_i64))
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 8) {
        tcg_gen_ld_i64(tcg_ctx, t0, tcg_ctx->cpu_env, aofs + i);
        if (scalar_first) {
            fni(tcg_ctx, t1, c, t0);
        } else {
            fni(tcg_ctx, t1, t0, c);
        }
        tcg_gen_st_i64(tcg_ctx, t1, tcg_ctx->cpu_env, dofs + i);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}